

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O0

void set_cartridge(cartridge_t cart)

{
  int iVar1;
  int in_stack_00000008;
  int in_stack_0000000c;
  byte bStack0000000000000010;
  int romsize;
  
  if (in_stack_00000008 == 0) {
    num_wram_banks = 2;
  }
  if (in_stack_0000000c == 0) {
    if (_bStack0000000000000010 != 0) {
      err(F,"ROM size too big for this type of cartridge");
    }
    if (romsize != 0) {
      err(F,"RAM size too big for this type of cartridge");
    }
  }
  else {
    err(F,"unknwon cartridge type");
  }
  iVar1 = 0x8000 << (bStack0000000000000010 & 0x1f);
  if (iVar1 < 0) {
    iVar1 = iVar1 + 0x3fff;
  }
  num_rom_banks = iVar1 >> 0xe;
  num_ram_banks = 1;
  return;
}

Assistant:

void set_cartridge(cartridge_t cart)
{
    int romsize;

    if (cart.gb_type == dmg)
        num_wram_banks = 2;

    if (cart.cart_type == rom_only)
    {
        if (cart.rom_size != _32K)
            err(F, "ROM size too big for this type of cartridge");
        if (cart.ram_size != no_ram)
            err(F, "RAM size too big for this type of cartridge");
    }
    else
        err(F, "unknwon cartridge type");

    romsize = 0x8000 << (int)cart.rom_size;
    num_rom_banks = romsize / ROM_BANK_SIZE;

    switch(cart.ram_size)
    {
        /* In order to make .org work we need a RAM slot even if there
         is no ram */
        case no_ram:
        default: num_ram_banks = 1;
    }
}